

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int ReadHuffmanCodesHelper
              (int color_cache_bits,int num_htree_groups,int num_htree_groups_max,int *mapping,
              VP8LDecoder *dec,HuffmanTables *huffman_tables,HTreeGroup **htree_groups)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  HTreeGroup *pHVar4;
  long *plVar5;
  VP8LDecoder *in_RCX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  VP8LDecoder *in_R8;
  HuffmanTables *in_R9;
  long *in_stack_00000008;
  int alpha;
  int blue;
  int red;
  int k;
  int local_max_bits;
  int alphabet_size_1;
  int max_bits;
  int is_trivial_literal;
  int total_size;
  int size;
  HuffmanCode **htrees;
  HTreeGroup *htree_group;
  int alphabet_size;
  int *code_lengths;
  int table_size;
  int max_alphabet_size;
  int ok;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  uint in_stack_ffffffffffffff60;
  uint uVar6;
  VP8StatusCode in_stack_ffffffffffffff64;
  uint64_t in_stack_ffffffffffffff68;
  undefined4 uVar7;
  int local_7c;
  int local_78;
  uint local_74;
  int local_70;
  uint local_6c;
  int local_68;
  int local_34;
  int local_30;
  VP8StatusCode local_2c;
  int in_stack_fffffffffffffff0;
  
  local_34 = 0;
  uVar7 = 0x118;
  if (in_EDI < 1) {
    iVar1 = 0;
  }
  else {
    iVar1 = 1 << ((byte)in_EDI & 0x1f);
  }
  if (((in_RCX != (VP8LDecoder *)0x0) || (in_ESI == in_EDX)) && (in_ESI <= in_EDX)) {
    piVar3 = (int *)WebPSafeCalloc(in_stack_ffffffffffffff68,
                                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    pHVar4 = VP8LHtreeGroupsNew(in_stack_ffffffffffffff5c);
    *in_stack_00000008 = (long)pHVar4;
    if (((*in_stack_00000008 == 0) || (piVar3 == (int *)0x0)) ||
       (iVar2 = VP8LHuffmanTablesAllocate
                          (in_stack_ffffffffffffff60,
                           (HuffmanTables *)
                           CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)),
       iVar2 == 0)) {
      VP8LSetError(in_R8,VP8_STATUS_OUT_OF_MEMORY);
    }
    else {
      for (local_2c = VP8_STATUS_OK; (int)local_2c < in_EDX;
          local_2c = local_2c + VP8_STATUS_OUT_OF_MEMORY) {
        if ((in_RCX == (VP8LDecoder *)0x0) || ((&in_RCX->status)[(int)local_2c] != ~VP8_STATUS_OK))
        {
          in_stack_ffffffffffffff64 = local_2c;
          if (in_RCX != (VP8LDecoder *)0x0) {
            in_stack_ffffffffffffff64 = (&in_RCX->status)[(int)local_2c];
          }
          plVar5 = (long *)(*in_stack_00000008 + (long)(int)in_stack_ffffffffffffff64 * 0x238);
          local_68 = 0;
          local_6c = 1;
          local_70 = 0;
          uVar6 = in_stack_ffffffffffffff60;
          for (local_30 = 0; local_30 < 5; local_30 = local_30 + 1) {
            local_74 = (uint)kAlphabetSize[local_30];
            if ((local_30 == 0) && (0 < in_EDI)) {
              local_74 = (1 << ((byte)in_EDI & 0x1f)) + local_74;
            }
            iVar2 = ReadHuffmanCode(in_stack_fffffffffffffff0,in_RCX,(int *)in_R8,in_R9);
            plVar5[local_30] = (long)in_R9->curr_segment->curr_table;
            in_stack_ffffffffffffff60 = uVar6;
            if (iVar2 == 0) goto LAB_001442cc;
            if ((local_6c != 0) && (""[local_30] == '\x01')) {
              local_6c = (uint)(*(char *)plVar5[local_30] == '\0');
            }
            local_68 = (uint)*(byte *)plVar5[local_30] + local_68;
            in_R9->curr_segment->curr_table = in_R9->curr_segment->curr_table + iVar2;
            if (local_30 < 4) {
              local_78 = *piVar3;
              for (local_7c = 1; local_7c < (int)local_74; local_7c = local_7c + 1) {
                if (local_78 < piVar3[local_7c]) {
                  local_78 = piVar3[local_7c];
                }
              }
              local_70 = local_78 + local_70;
            }
          }
          *(uint *)(plVar5 + 5) = local_6c;
          *(undefined4 *)(plVar5 + 6) = 0;
          if (((local_6c != 0) &&
              (*(uint *)((long)plVar5 + 0x2c) =
                    (uint)*(ushort *)(plVar5[3] + 2) << 0x18 |
                    (uint)*(ushort *)(plVar5[1] + 2) << 0x10 | (uint)*(ushort *)(plVar5[2] + 2),
              local_68 == 0)) && (*(ushort *)(*plVar5 + 2) < 0x100)) {
            *(undefined4 *)(plVar5 + 6) = 1;
            *(uint *)((long)plVar5 + 0x2c) =
                 (uint)*(ushort *)(*plVar5 + 2) << 8 | *(uint *)((long)plVar5 + 0x2c);
          }
          in_stack_ffffffffffffff60 = uVar6 & 0xffffff;
          if ((int)plVar5[6] == 0) {
            in_stack_ffffffffffffff60 = CONCAT13(local_70 < 6,(int3)uVar6);
          }
          *(uint *)((long)plVar5 + 0x34) = in_stack_ffffffffffffff60 >> 0x18;
          if (*(int *)((long)plVar5 + 0x34) != 0) {
            BuildPackedTable((HTreeGroup *)CONCAT44(uVar7,iVar1));
          }
        }
        else {
          for (local_30 = 0; local_30 < 5; local_30 = local_30 + 1) {
            iVar2 = ReadHuffmanCode(in_stack_fffffffffffffff0,in_RCX,(int *)in_R8,in_R9);
            if (iVar2 == 0) goto LAB_001442cc;
          }
        }
      }
      local_34 = 1;
    }
  }
LAB_001442cc:
  WebPSafeFree((void *)0x1442d6);
  if (local_34 == 0) {
    VP8LHuffmanTablesDeallocate
              ((HuffmanTables *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    VP8LHtreeGroupsFree((HTreeGroup *)0x1442fa);
    *in_stack_00000008 = 0;
  }
  return local_34;
}

Assistant:

int ReadHuffmanCodesHelper(int color_cache_bits, int num_htree_groups,
                           int num_htree_groups_max, const int* const mapping,
                           VP8LDecoder* const dec,
                           HuffmanTables* const huffman_tables,
                           HTreeGroup** const htree_groups) {
  int i, j, ok = 0;
  const int max_alphabet_size =
      kAlphabetSize[0] + ((color_cache_bits > 0) ? 1 << color_cache_bits : 0);
  const int table_size = kTableSize[color_cache_bits];
  int* code_lengths = NULL;

  if ((mapping == NULL && num_htree_groups != num_htree_groups_max) ||
      num_htree_groups > num_htree_groups_max) {
    goto Error;
  }

  code_lengths =
      (int*)WebPSafeCalloc((uint64_t)max_alphabet_size, sizeof(*code_lengths));
  *htree_groups = VP8LHtreeGroupsNew(num_htree_groups);

  if (*htree_groups == NULL || code_lengths == NULL ||
      !VP8LHuffmanTablesAllocate(num_htree_groups * table_size,
                                 huffman_tables)) {
    VP8LSetError(dec, VP8_STATUS_OUT_OF_MEMORY);
    goto Error;
  }

  for (i = 0; i < num_htree_groups_max; ++i) {
    // If the index "i" is unused in the Huffman image, just make sure the
    // coefficients are valid but do not store them.
    if (mapping != NULL && mapping[i] == -1) {
      for (j = 0; j < HUFFMAN_CODES_PER_META_CODE; ++j) {
        int alphabet_size = kAlphabetSize[j];
        if (j == 0 && color_cache_bits > 0) {
          alphabet_size += (1 << color_cache_bits);
        }
        // Passing in NULL so that nothing gets filled.
        if (!ReadHuffmanCode(alphabet_size, dec, code_lengths, NULL)) {
          goto Error;
        }
      }
    } else {
      HTreeGroup* const htree_group =
          &(*htree_groups)[(mapping == NULL) ? i : mapping[i]];
      HuffmanCode** const htrees = htree_group->htrees;
      int size;
      int total_size = 0;
      int is_trivial_literal = 1;
      int max_bits = 0;
      for (j = 0; j < HUFFMAN_CODES_PER_META_CODE; ++j) {
        int alphabet_size = kAlphabetSize[j];
        if (j == 0 && color_cache_bits > 0) {
          alphabet_size += (1 << color_cache_bits);
        }
        size =
            ReadHuffmanCode(alphabet_size, dec, code_lengths, huffman_tables);
        htrees[j] = huffman_tables->curr_segment->curr_table;
        if (size == 0) {
          goto Error;
        }
        if (is_trivial_literal && kLiteralMap[j] == 1) {
          is_trivial_literal = (htrees[j]->bits == 0);
        }
        total_size += htrees[j]->bits;
        huffman_tables->curr_segment->curr_table += size;
        if (j <= ALPHA) {
          int local_max_bits = code_lengths[0];
          int k;
          for (k = 1; k < alphabet_size; ++k) {
            if (code_lengths[k] > local_max_bits) {
              local_max_bits = code_lengths[k];
            }
          }
          max_bits += local_max_bits;
        }
      }
      htree_group->is_trivial_literal = is_trivial_literal;
      htree_group->is_trivial_code = 0;
      if (is_trivial_literal) {
        const int red = htrees[RED][0].value;
        const int blue = htrees[BLUE][0].value;
        const int alpha = htrees[ALPHA][0].value;
        htree_group->literal_arb = ((uint32_t)alpha << 24) | (red << 16) | blue;
        if (total_size == 0 && htrees[GREEN][0].value < NUM_LITERAL_CODES) {
          htree_group->is_trivial_code = 1;
          htree_group->literal_arb |= htrees[GREEN][0].value << 8;
        }
      }
      htree_group->use_packed_table =
          !htree_group->is_trivial_code && (max_bits < HUFFMAN_PACKED_BITS);
      if (htree_group->use_packed_table) BuildPackedTable(htree_group);
    }
  }
  ok = 1;

 Error:
  WebPSafeFree(code_lengths);
  if (!ok) {
    VP8LHuffmanTablesDeallocate(huffman_tables);
    VP8LHtreeGroupsFree(*htree_groups);
    *htree_groups = NULL;
  }
  return ok;
}